

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
sendCode(uint64_t sCode,int runCount,uint64_t runCode,uint64_t *c,int *lc,uint8_t **out,
        uint8_t *outend)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  exr_result_t eVar4;
  uint64_t *in_RCX;
  uint64_t in_RDX;
  int in_ESI;
  uint64_t in_RDI;
  uint64_t *in_R8;
  uint8_t **in_R9;
  uint8_t *in_stack_00000008;
  exr_result_t rv;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  int local_c;
  
  iVar1 = hufLength(in_RDI);
  iVar2 = hufLength(in_RDX);
  uVar3 = iVar1 + iVar2 + 8;
  iVar2 = hufLength(in_RDI);
  if ((int)uVar3 < iVar2 * in_ESI) {
    eVar4 = outputCode((uint64_t)in_RCX,in_R8,(int *)in_R9,
                       (uint8_t **)CONCAT44(in_stack_ffffffffffffffcc,uVar3),
                       (uint8_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
    if (eVar4 == 0) {
      eVar4 = outputCode((uint64_t)in_RCX,in_R8,(int *)in_R9,(uint8_t **)(ulong)uVar3,
                         (uint8_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
    }
    if (eVar4 == 0) {
      eVar4 = outputBits(8,(long)in_ESI,in_RCX,(int *)in_R8,in_R9,in_stack_00000008);
    }
  }
  else {
    eVar4 = 0;
    local_c = in_ESI;
    do {
      if (local_c < 0) {
        return eVar4;
      }
      eVar4 = outputCode((uint64_t)in_RCX,in_R8,(int *)in_R9,(uint8_t **)CONCAT44(eVar4,uVar3),
                         (uint8_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
      local_c = local_c + -1;
    } while (eVar4 == 0);
  }
  return eVar4;
}

Assistant:

static inline exr_result_t
sendCode (
    uint64_t  sCode,
    int       runCount,
    uint64_t  runCode,
    uint64_t* c,
    int*      lc,
    uint8_t** out,
    uint8_t*  outend)
{
    exr_result_t rv;
    if (hufLength (sCode) + hufLength (runCode) + 8 <
        hufLength (sCode) * runCount)
    {
        rv = outputCode (sCode, c, lc, out, outend);
        if (rv == EXR_ERR_SUCCESS)
            rv = outputCode (runCode, c, lc, out, outend);
        if (rv == EXR_ERR_SUCCESS)
            rv = outputBits (8, (uint64_t) runCount, c, lc, out, outend);
    }
    else
    {
        rv = EXR_ERR_SUCCESS;
        while (runCount-- >= 0)
        {
            rv = outputCode (sCode, c, lc, out, outend);
            if (rv != EXR_ERR_SUCCESS) break;
        }
    }
    return rv;
}